

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_size(t_my_numbox *x,t_symbol *s,int ac,t_atom *av)

{
  t_float tVar1;
  int local_30;
  int local_2c;
  int w;
  int h;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  t_my_numbox *x_local;
  
  tVar1 = atom_getfloatarg(0,ac,av);
  local_30 = (int)tVar1;
  if (local_30 < 1) {
    local_30 = 1;
  }
  x->x_numwidth = local_30;
  if (1 < ac) {
    tVar1 = atom_getfloatarg(1,ac,av);
    local_2c = (int)tVar1;
    if (local_2c < 8) {
      local_2c = 8;
    }
    (x->x_gui).x_h = local_2c * ((x->x_gui).x_glist)->gl_zoom;
  }
  my_numbox_calc_fontwidth(x);
  iemgui_size(x,&x->x_gui);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  return;
}

Assistant:

static void my_numbox_size(t_my_numbox *x, t_symbol *s, int ac, t_atom *av)
{
    int h, w;

    w = (int)atom_getfloatarg(0, ac, av);
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(ac > 1)
    {
        h = (int)atom_getfloatarg(1, ac, av);
        if(h < IEM_GUI_MINSIZE)
            h = IEM_GUI_MINSIZE;
        x->x_gui.x_h = h * IEMGUI_ZOOM(x);
    }
    my_numbox_calc_fontwidth(x);
    iemgui_size((void *)x, &x->x_gui);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
}